

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_long>
          (TryCast *this,string_t input,uint64_t *result,bool strict)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  idx_t pos;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char cVar11;
  undefined4 uVar12;
  uint uVar13;
  byte bVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  idx_t iVar18;
  bool bVar19;
  ExponentData exponent;
  ulong local_90;
  IntegerDecimalCastData<unsigned_long> local_78;
  ulong *local_58;
  undefined4 local_4c;
  char *local_48;
  string_t input_local;
  
  local_58 = input.value._8_8_;
  bVar1 = (byte)result;
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar15 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar15 = input_local.value.pointer.prefix;
  }
  uVar9 = (ulong)this & 0xffffffff;
  for (uVar17 = 0; uVar10 = uVar9 - uVar17, input_local.value._0_8_ = this, uVar10 != 0;
      uVar17 = uVar17 + 1) {
    bVar14 = pcVar15[uVar17];
    if ((4 < bVar14 - 9) && (bVar14 != 0x20)) {
      if (bVar14 == 0x2d) {
        uVar4 = uVar9 - uVar17;
        uVar10 = 1;
        goto LAB_0024510e;
      }
      if ((uVar9 - 1 == uVar17) || (bVar14 != 0x30)) {
        if ((bVar14 == 0x2b & bVar1) == 0) {
          uVar13 = (uint)(bVar14 == 0x2b);
LAB_00245328:
          uVar16 = (ulong)uVar13;
          local_90 = 0;
          uVar4 = uVar16;
          goto LAB_00245337;
        }
        break;
      }
      cVar11 = pcVar15[uVar17 + 1];
      if (cVar11 == 'B') {
LAB_00245414:
        uVar10 = ~uVar17 + uVar9;
        local_90 = 0;
        uVar16 = 1;
        goto LAB_00245428;
      }
      if (cVar11 != 'x') {
        if (cVar11 == 'b') goto LAB_00245414;
        if (cVar11 != 'X') {
          if (((byte)(cVar11 - 0x30U) < 10 & bVar1) == 0) {
            uVar13 = 0;
            goto LAB_00245328;
          }
          break;
        }
      }
      uVar10 = ~uVar17 + uVar9;
      local_90 = 0;
      uVar16 = 1;
      goto LAB_0024518c;
    }
  }
  goto LAB_002455de;
LAB_0024528b:
  uVar16 = uVar10;
  if (uVar4 <= uVar16) goto joined_r0x002455d1;
  bVar14 = pcVar15[uVar17 + uVar16];
  if (9 < (byte)(bVar14 - 0x30)) {
    if (bVar14 == 0x2e) {
      if (bVar1 != 0) goto LAB_002455de;
      if (uVar4 <= uVar16 + 1) goto joined_r0x002455d1;
      if ((uVar16 < 2) ||
         (bVar14 = pcVar15[uVar17 + 1 + uVar16], uVar16 = uVar16 + 1, (byte)(bVar14 - 0x30) < 10))
      goto LAB_002455de;
    }
    if ((bVar14 < 0x21) && ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
      uVar10 = uVar16 + 1;
      uVar16 = uVar10;
      if (uVar10 < uVar4) {
        uVar16 = uVar4;
      }
      goto LAB_00245534;
    }
    goto LAB_002455de;
  }
  local_90 = local_90 * 10 - (ulong)(byte)(bVar14 - 0x30);
  uVar10 = uVar4;
  if (((~uVar16 + uVar9 != uVar17) &&
      (uVar10 = uVar16 + 1, pcVar15[uVar17 + 1 + uVar16] == '_' && bVar1 == 0)) &&
     (((uVar9 - uVar16) - 2 == uVar17 ||
      (uVar10 = uVar16 + 2, 9 < (byte)(pcVar15[uVar17 + 2 + uVar16] - 0x30U))))) goto LAB_002455de;
  goto LAB_0024528b;
LAB_00245534:
  if (uVar4 <= uVar10) goto joined_r0x002455d1;
  if ((0x20 < (ulong)(byte)pcVar15[uVar17 + uVar10]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar10] & 0x3f) & 1) == 0)) goto LAB_002455de;
  uVar10 = uVar10 + 1;
  goto LAB_00245534;
LAB_00245428:
  if (uVar10 <= uVar16) goto joined_r0x002455d1;
  if (pcVar15[uVar17 + 1 + uVar16] == '0') {
    uVar4 = 0;
  }
  else {
    uVar4 = 1;
    if (pcVar15[uVar17 + 1 + uVar16] != '1') goto LAB_002455de;
  }
  uVar5 = uVar10;
  if ((uVar9 - uVar16) - 2 != uVar17) {
    if (pcVar15[uVar17 + 2 + uVar16] == '_') {
      if (((uVar9 - uVar16) - 3 == uVar17) || ((pcVar15[uVar17 + 3 + uVar16] & 0xfeU) != 0x30))
      goto LAB_002455de;
      uVar5 = uVar16 + 2;
    }
    else {
      uVar5 = uVar16 + 1;
    }
  }
  uVar16 = uVar5;
  if ((long)local_90 < 0) goto LAB_002455de;
  local_90 = uVar4 + local_90 * 2;
  goto LAB_00245428;
LAB_00245337:
  uVar5 = uVar4;
  if (uVar10 <= uVar5) goto LAB_002454bf;
  bVar14 = pcVar15[uVar17 + uVar5];
  bVar3 = bVar14 - 0x30;
  if (9 < bVar3) {
    if (bVar14 == 0x2e) {
      if (bVar1 != 0) goto LAB_002455de;
      uVar4 = uVar5 + 1;
      if (uVar10 <= uVar4) {
        bVar19 = uVar16 < uVar5;
        uVar5 = uVar4;
        if (bVar19) goto LAB_002454bf;
        goto LAB_002455de;
      }
      if ((uVar5 <= uVar16) ||
         (bVar14 = pcVar15[uVar17 + 1 + uVar5], uVar5 = uVar4, (byte)(bVar14 - 0x30) < 10))
      goto LAB_002455de;
    }
    if ((bVar14 < 0x21) && ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) != 0)) {
      uVar4 = uVar5 + 1;
      uVar5 = uVar4;
      if (uVar4 < uVar10) {
        uVar5 = uVar10;
      }
      goto LAB_002455aa;
    }
    goto LAB_002455de;
  }
  if ((~(ulong)bVar3 / 10 < local_90) ||
     (((local_90 = local_90 * 10 + (ulong)bVar3, uVar4 = uVar10, ~uVar5 + uVar9 != uVar17 &&
       (uVar4 = uVar5 + 1, pcVar15[uVar17 + 1 + uVar5] == '_' && bVar1 == 0)) &&
      (((uVar9 - uVar5) - 2 == uVar17 ||
       (uVar4 = uVar5 + 2, 9 < (byte)(pcVar15[uVar17 + 2 + uVar5] - 0x30U))))))) goto LAB_002455de;
  goto LAB_00245337;
LAB_002455aa:
  if (uVar10 <= uVar4) goto LAB_002454bf;
  if ((0x20 < (ulong)(byte)pcVar15[uVar17 + uVar4]) ||
     ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar4] & 0x3f) & 1) == 0)) goto LAB_002455de;
  uVar4 = uVar4 + 1;
  goto LAB_002455aa;
LAB_002454bf:
  if (uVar16 < uVar5) goto LAB_00245561;
  goto LAB_002455de;
LAB_0024518c:
  if (uVar10 <= uVar16) goto joined_r0x002455d1;
  local_48 = pcVar15 + uVar16;
  bVar14 = local_48[uVar17 + 1];
  bVar3 = bVar14 | 0x20;
  if (0x19 < (byte)(bVar14 + 0xbf)) {
    bVar3 = bVar14;
  }
  bVar19 = StringUtil::CharacterIsHex(bVar3);
  if (!bVar19) goto LAB_002455de;
  uVar12 = 0xd0;
  if ('`' < (char)bVar3) {
    uVar12 = 0xa9;
  }
  uVar4 = uVar10;
  if ((uVar9 - uVar16) - 2 != uVar17) {
    if (local_48[uVar17 + 2] == '_') {
      local_4c = uVar12;
      if (((uVar9 - uVar16) - 3 == uVar17) ||
         (bVar19 = StringUtil::CharacterIsHex(local_48[uVar17 + 3]), !bVar19)) goto LAB_002455de;
      uVar4 = uVar16 + 2;
      uVar12 = local_4c;
    }
    else {
      uVar4 = uVar16 + 1;
    }
  }
  uVar16 = (ulong)(byte)((char)uVar12 + bVar3);
  if (~uVar16 >> 4 < local_90) goto LAB_002455de;
  local_90 = local_90 * 0x10 + uVar16;
  uVar16 = uVar4;
  goto LAB_0024518c;
joined_r0x002455d1:
  if (1 < uVar16) {
LAB_00245561:
    *local_58 = local_90;
    return true;
  }
  goto LAB_002455de;
LAB_002458f9:
  uVar6 = uVar5;
  if (uVar6 < uVar10) {
    bVar14 = pcVar15[uVar17 + uVar6];
    bVar3 = bVar14 - 0x30;
    if (bVar3 < 10) goto code_r0x00245918;
    bVar19 = uVar16 < 2;
    local_78._18_6_ = 0;
    uVar16 = uVar6;
    if (uVar6 <= uVar4 && bVar19) {
      return false;
    }
LAB_00245b18:
    uVar13 = (uint)bVar14;
    if (uVar13 - 9 < 5) {
LAB_00245b27:
      uVar9 = uVar16 + 1;
      uVar16 = uVar9;
      if (uVar9 < uVar10) {
        uVar16 = uVar10;
      }
      for (; uVar9 < uVar10; uVar9 = uVar9 + 1) {
        if (0x20 < (ulong)(byte)pcVar15[uVar17 + uVar9]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar9] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_002458ad;
    }
    if ((uVar13 != 0x65) && (uVar13 != 0x45)) {
      if (uVar13 != 0x20) {
        return false;
      }
      goto LAB_00245b27;
    }
    if (uVar16 == 1 || bVar1 != 0) {
      return false;
    }
    if (uVar10 <= uVar16 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar15 = pcVar15 + uVar17 + uVar16 + 1;
    iVar18 = ~uVar17 + (uVar9 - uVar16);
    if (*pcVar15 == '-') {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    else {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    if (bVar19 == false) {
      return false;
    }
    bVar19 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                       (&local_78,exponent.result);
    goto joined_r0x00245ba7;
  }
  bVar19 = uVar16 < 2;
  local_78._18_6_ = 0;
  uVar16 = uVar6;
  if (uVar6 <= uVar4 && bVar19) {
    return false;
  }
  goto LAB_002458ad;
code_r0x00245918:
  uVar7 = ~(ulong)bVar3 / 10;
  bVar19 = local_78.decimal <= uVar7;
  uVar5 = local_78.decimal * 10 + (ulong)bVar3;
  if (uVar7 < local_78.decimal) {
    uVar5 = local_78.decimal;
  }
  local_78.decimal = uVar5;
  local_78.decimal_digits = local_78.decimal_digits + bVar19;
  uVar5 = uVar10;
  if ((~uVar6 + uVar9 != uVar17) && (uVar5 = uVar6 + 1, pcVar15[uVar17 + 1 + uVar6] == '_')) {
    if ((uVar9 - uVar6) - 2 == uVar17) {
      return false;
    }
    uVar5 = uVar6 + 2;
    if (9 < (byte)(pcVar15[uVar17 + 2 + uVar6] - 0x30U)) {
      return false;
    }
  }
  goto LAB_002458f9;
LAB_00245a78:
  uVar16 = uVar7;
  if (uVar16 < uVar10) {
    bVar14 = pcVar15[uVar17 + uVar16];
    bVar3 = bVar14 - 0x30;
    if (bVar3 < 10) goto code_r0x00245a98;
    local_78._18_6_ = 0;
    if (uVar16 <= uVar6 && uVar5 <= uVar4) {
      return false;
    }
LAB_00245cc8:
    uVar13 = (uint)bVar14;
    if (uVar13 - 9 < 5) {
LAB_00245cd3:
      uVar16 = uVar16 + 1;
      uVar5 = uVar16;
      if (uVar16 < uVar10) {
        uVar5 = uVar10;
      }
      for (; uVar16 < uVar10; uVar16 = uVar16 + 1) {
        if (0x20 < (ulong)(byte)pcVar15[uVar17 + uVar16]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar17 + uVar16] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_00245a2a;
    }
    if ((uVar13 != 0x65) && (uVar13 != 0x45)) {
      if (uVar13 != 0x20) {
        return false;
      }
      goto LAB_00245cd3;
    }
    if (uVar16 == uVar4 || bVar1 != 0) {
      return false;
    }
    if (uVar10 <= uVar16 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar15 = pcVar15 + uVar17 + uVar16 + 1;
    iVar18 = ~uVar17 + (uVar9 - uVar16);
    if (*pcVar15 == '-') {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    else {
      bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                         (pcVar15,iVar18,&exponent,false);
    }
    if (bVar19 == false) {
      return false;
    }
    bVar19 = IntegerDecimalCastOperation::
             HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                       (&local_78,exponent.result);
    goto joined_r0x00245ba7;
  }
  bVar19 = uVar5 <= uVar4;
  local_78._18_6_ = 0;
  uVar5 = uVar16;
  if (uVar16 <= uVar6 && bVar19) {
    return false;
  }
  goto LAB_00245a2a;
code_r0x00245a98:
  uVar8 = ~(ulong)bVar3 / 10;
  bVar19 = local_78.decimal <= uVar8;
  uVar7 = local_78.decimal * 10 + (ulong)bVar3;
  if (uVar8 < local_78.decimal) {
    uVar7 = local_78.decimal;
  }
  local_78.decimal = uVar7;
  local_78.decimal_digits = local_78.decimal_digits + bVar19;
  uVar7 = uVar10;
  if ((~uVar16 + uVar9 != uVar17) && (uVar7 = uVar16 + 1, pcVar15[uVar17 + 1 + uVar16] == '_')) {
    if ((uVar9 - uVar16) - 2 == uVar17) {
      return false;
    }
    uVar7 = uVar16 + 2;
    if (9 < (byte)(pcVar15[uVar17 + 2 + uVar16] - 0x30U)) {
      return false;
    }
  }
  goto LAB_00245a78;
  while (lVar2 = uVar17 + uVar10, uVar10 = uVar10 + 1, pcVar15[lVar2] == '0') {
LAB_0024510e:
    if (uVar4 <= uVar10) {
      local_90 = 0;
      uVar10 = 1;
      goto LAB_0024528b;
    }
  }
LAB_002455de:
  uVar17 = 0;
  while( true ) {
    uVar10 = uVar9 - uVar17;
    if (uVar10 == 0) {
      return false;
    }
    bVar14 = pcVar15[uVar17];
    if ((0x20 < (ulong)bVar14) || ((0x100003e00U >> ((ulong)bVar14 & 0x3f) & 1) == 0)) break;
    uVar17 = uVar17 + 1;
  }
  local_78.result = 0;
  local_78.decimal = 0;
  local_78._16_8_ = 0;
  if (bVar14 == 0x2d) {
    uVar4 = 1;
    while (uVar4 < uVar10) {
      lVar2 = uVar17 + uVar4;
      uVar4 = uVar4 + 1;
      if (pcVar15[lVar2] != '0') {
        return false;
      }
    }
    local_78.result = 0;
    uVar4 = 1;
    while (uVar16 = uVar4, uVar16 < uVar10) {
      bVar14 = pcVar15[uVar17 + uVar16];
      if (9 < (byte)(bVar14 - 0x30)) {
        if (bVar14 != 0x2e) goto LAB_00245b18;
        if (bVar1 != 0) {
          return false;
        }
        uVar4 = uVar16 + 1;
        local_78.decimal_digits = 0;
        local_78.decimal = 0;
        uVar5 = uVar4;
        goto LAB_002458f9;
      }
      local_78.result = local_78.result * 10 - (ulong)(byte)(bVar14 - 0x30);
      uVar4 = uVar10;
      if ((~uVar16 + uVar9 != uVar17) &&
         (uVar4 = uVar16 + 1, pcVar15[uVar17 + 1 + uVar16] == '_' && bVar1 == 0)) {
        if ((uVar9 - uVar16) - 2 == uVar17) {
          return false;
        }
        uVar4 = uVar16 + 2;
        if (9 < (byte)(pcVar15[uVar17 + 2 + uVar16] - 0x30U)) {
          return false;
        }
      }
    }
LAB_002458ad:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>(&local_78);
    if (!bVar19) {
      return false;
    }
    if (uVar16 < 2) {
      return false;
    }
    goto LAB_00245bad;
  }
  if ((uVar9 - 1 == uVar17) || (bVar14 != 0x30)) {
    if ((bVar14 == 0x2b & bVar1) != 0) {
      return false;
    }
    uVar4 = (ulong)(bVar14 == 0x2b);
LAB_00245800:
    local_78.result = 0;
    uVar16 = uVar4;
    while (uVar5 = uVar16, uVar5 < uVar10) {
      bVar14 = pcVar15[uVar17 + uVar5];
      bVar3 = bVar14 - 0x30;
      if (9 < bVar3) {
        uVar16 = uVar5;
        if (bVar14 != 0x2e) goto LAB_00245cc8;
        if (bVar1 != 0) {
          return false;
        }
        uVar6 = uVar5 + 1;
        local_78.decimal_digits = 0;
        local_78.decimal = 0;
        uVar7 = uVar6;
        goto LAB_00245a78;
      }
      if (~(ulong)bVar3 / 10 < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar3;
      uVar16 = uVar10;
      if ((~uVar5 + uVar9 != uVar17) &&
         (uVar16 = uVar5 + 1, pcVar15[uVar17 + 1 + uVar5] == '_' && bVar1 == 0)) {
        if ((uVar9 - uVar5) - 2 == uVar17) {
          return false;
        }
        uVar16 = uVar5 + 2;
        if (9 < (byte)(pcVar15[uVar17 + 2 + uVar5] - 0x30U)) {
          return false;
        }
      }
    }
LAB_00245a2a:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_78);
    if (!bVar19) {
      return false;
    }
    if (uVar5 <= uVar4) {
      return false;
    }
    goto LAB_00245bad;
  }
  cVar11 = pcVar15[uVar17 + 1];
  if (cVar11 == 'B') {
LAB_00245991:
    local_78.result = 0;
    uVar10 = 1;
    while (uVar10 < ~uVar17 + uVar9) {
      uVar4 = 0;
      if ((pcVar15[uVar17 + 1 + uVar10] != '0') && (uVar4 = 1, pcVar15[uVar17 + 1 + uVar10] != '1'))
      {
        return false;
      }
      uVar16 = ~uVar17 + uVar9;
      if ((uVar9 - uVar10) - 2 != uVar17) {
        if (pcVar15[uVar17 + 2 + uVar10] == '_') {
          if ((uVar9 - uVar10) - 3 == uVar17) {
            return false;
          }
          if ((pcVar15[uVar17 + 3 + uVar10] & 0xfeU) != 0x30) {
            return false;
          }
          uVar16 = uVar10 + 2;
        }
        else {
          uVar16 = uVar10 + 1;
        }
      }
      uVar10 = uVar16;
      if ((long)local_78.result < 0) {
        return false;
      }
      local_78.result = uVar4 + local_78.result * 2;
    }
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_78);
  }
  else {
    if (cVar11 != 'x') {
      if (cVar11 == 'b') goto LAB_00245991;
      if (cVar11 != 'X') {
        if (((byte)(cVar11 - 0x30U) < 10 & bVar1) != 0) {
          return false;
        }
        uVar4 = 0;
        goto LAB_00245800;
      }
    }
    uVar4 = 0;
    uVar10 = 1;
    while (uVar10 < ~uVar17 + uVar9) {
      bVar1 = pcVar15[uVar17 + 1 + uVar10];
      bVar14 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar14 = bVar1;
      }
      bVar19 = StringUtil::CharacterIsHex(bVar14);
      if (!bVar19) {
        return false;
      }
      cVar11 = -0x30;
      if ('`' < (char)bVar14) {
        cVar11 = -0x57;
      }
      uVar16 = ~uVar17 + uVar9;
      if ((uVar9 - uVar10) - 2 != uVar17) {
        if (pcVar15[uVar17 + 2 + uVar10] == '_') {
          if ((uVar9 - uVar10) - 3 == uVar17) {
            return false;
          }
          bVar19 = StringUtil::CharacterIsHex(pcVar15[uVar17 + 3 + uVar10]);
          if (!bVar19) {
            return false;
          }
          uVar16 = uVar10 + 2;
        }
        else {
          uVar16 = uVar10 + 1;
        }
      }
      if (~(ulong)(byte)(cVar11 + bVar14) >> 4 < uVar4) {
        return false;
      }
      uVar4 = uVar4 * 0x10 + (ulong)(byte)(cVar11 + bVar14);
      uVar10 = uVar16;
    }
    local_78.result = uVar4;
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_78);
  }
  bVar19 = (bool)(1 < uVar10 & bVar19);
joined_r0x00245ba7:
  if (bVar19 == false) {
    return false;
  }
LAB_00245bad:
  *local_58 = local_78.result;
  return true;
}

Assistant:

bool TryCast::Operation(string_t input, uint64_t &result, bool strict) {
	return TrySimpleIntegerCast<uint64_t, false>(input.GetData(), input.GetSize(), result, strict);
}